

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

int32_t __thiscall GameEngine::registerPlayer(GameEngine *this,string *name)

{
  element_type *this_00;
  __type _Var1;
  int32_t id;
  shared_ptr<Player> player;
  shared_ptr<Player> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  std::make_shared<Player>();
  id = (int32_t)((ulong)((long)(this->players).
                               super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->players).
                              super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
  Player::SetId(local_98.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,id);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Bot",(allocator<char> *)&local_68);
  _Var1 = std::operator==(name,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  this_00 = local_98.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (_Var1) {
    std::operator+(&local_68,name," ");
    std::__cxx11::to_string(&local_48,id);
    std::operator+(&local_88,&local_68,&local_48);
    Player::SetName(this_00,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    Player::SetName(local_98.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,name);
  }
  Player::generatePopulations
            (local_98.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::vector<std::shared_ptr<Player>,std::allocator<std::shared_ptr<Player>>>::
  emplace_back<std::shared_ptr<Player>>
            ((vector<std::shared_ptr<Player>,std::allocator<std::shared_ptr<Player>>> *)
             &this->players,&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return id;
}

Assistant:

int32_t GameEngine::registerPlayer(const std::string &name) {
  std::shared_ptr<Player> player = std::make_shared<Player>();
  int32_t id = players.size();
  player->SetId(id);

  if (name == std::string("Bot")) {
    player->SetName(name + " " + std::to_string(id));
  } else {
    player->SetName(name);
  }

  player->generatePopulations();

  players.push_back(std::move(player));

  return id;
}